

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  JOCTET *pJVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  boolean bVar5;
  long in_RSI;
  working_state *in_RDI;
  jpeg_component_info *compptr;
  int ci;
  int blkn;
  working_state state;
  huff_entropy_ptr entropy;
  working_state *in_stack_ffffffffffffff98;
  int local_5c;
  c_derived_tbl *actbl;
  c_derived_tbl *dctbl;
  undefined8 uVar6;
  JCOEFPTR block;
  working_state *state_00;
  boolean local_4;
  
  pJVar2 = in_RDI[10].next_output_byte;
  uVar3 = **(undefined8 **)((in_RDI->cur).last_dc_val + 3);
  uVar4 = *(undefined8 *)(*(long *)((in_RDI->cur).last_dc_val + 3) + 8);
  actbl = *(c_derived_tbl **)(pJVar2 + 0x18);
  dctbl = *(c_derived_tbl **)(pJVar2 + 0x20);
  uVar6 = *(undefined8 *)(pJVar2 + 0x28);
  block = *(JCOEFPTR *)(pJVar2 + 0x30);
  state_00 = in_RDI;
  if (((in_RDI[5].cur.last_dc_val[2] == 0) || (*(int *)(pJVar2 + 0x38) != 0)) ||
     (bVar5 = emit_restart_s(in_stack_ffffffffffffff98,0), bVar5 != 0)) {
    for (local_5c = 0; local_5c < in_RDI[7].cur.put_bits; local_5c = local_5c + 1) {
      iVar1 = in_RDI[7].cur.last_dc_val[local_5c];
      bVar5 = encode_one_block(state_00,block,(int)((ulong)uVar6 >> 0x20),dctbl,actbl);
      if (bVar5 == 0) {
        return 0;
      }
      *(int *)(&stack0xffffffffffffffc4 + (long)iVar1 * 4) =
           (int)**(short **)(in_RSI + (long)local_5c * 8);
    }
    **(undefined8 **)((in_RDI->cur).last_dc_val + 3) = uVar3;
    *(undefined8 *)(*(long *)((in_RDI->cur).last_dc_val + 3) + 8) = uVar4;
    *(c_derived_tbl **)(pJVar2 + 0x18) = actbl;
    *(c_derived_tbl **)(pJVar2 + 0x20) = dctbl;
    *(undefined8 *)(pJVar2 + 0x28) = uVar6;
    *(JCOEFPTR *)(pJVar2 + 0x30) = block;
    if (in_RDI[5].cur.last_dc_val[2] != 0) {
      if (*(int *)(pJVar2 + 0x38) == 0) {
        *(int *)(pJVar2 + 0x38) = in_RDI[5].cur.last_dc_val[2];
        *(int *)(pJVar2 + 0x3c) = *(int *)(pJVar2 + 0x3c) + 1;
        *(uint *)(pJVar2 + 0x3c) = *(uint *)(pJVar2 + 0x3c) & 7;
      }
      *(int *)(pJVar2 + 0x38) = *(int *)(pJVar2 + 0x38) + -1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  ASSIGN_STATE(state.cur, entropy->saved);
  state.cinfo = cinfo;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! emit_restart_s(&state, entropy->next_restart_num))
	return FALSE;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    if (! encode_one_block(&state,
			   MCU_data[blkn][0], state.cur.last_dc_val[ci],
			   entropy->dc_derived_tbls[compptr->dc_tbl_no],
			   entropy->ac_derived_tbls[compptr->ac_tbl_no]))
      return FALSE;
    /* Update last_dc_val */
    state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  ASSIGN_STATE(entropy->saved, state.cur);

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}